

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Semi(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int c;
  Cec_ParSmf_t *pPars;
  Cec_ParSmf_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._32_8_ = argv;
  Cec_ManSmfSetDefaultParams((Cec_ParSmf_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002a667b:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._32_8_,"WRFSMCTmdvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Resim(): There is no AIG.\n");
        return 1;
      }
      Cec_ManSeqSemiformal(pAbc->pGia,(Cec_ParSmf_t *)&pPars);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002a6a4a;
      }
      Pars.nNonRefines = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nNonRefines;
      break;
    default:
      goto LAB_002a6a4a;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002a6a4a;
      }
      Pars.nWords = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nWords;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_002a6a4a;
      }
      Pars.nFrames = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nFrames;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_002a6a4a;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002a6a4a;
      }
      Pars.nRounds = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nRounds;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002a6a4a;
      }
      Pars.nMinOutputs = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nMinOutputs;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_002a6a4a;
      }
      pPars._0_4_ = atoi(*(char **)(Pars._32_8_ + (long)globalUtilOptind * 8));
      uVar2 = (uint)pPars;
      break;
    case 100:
      Pars.nBTLimit = Pars.nBTLimit ^ 1;
      goto LAB_002a667b;
    case 0x68:
      goto LAB_002a6a4a;
    case 0x6d:
      Pars.TimeLimit = Pars.TimeLimit ^ 1;
      goto LAB_002a667b;
    case 0x76:
      Pars.fDualOut = Pars.fDualOut ^ 1;
      goto LAB_002a667b;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_002a6a4a:
      Abc_Print(-2,"usage: &semi [-WRFSMCT num] [-mdvh]\n");
      Abc_Print(-2,"\t         performs semiformal refinement of equivalence classes\n");
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",(ulong)(uint)pPars)
      ;
      Abc_Print(-2,"\t-R num : the max number of rounds to simulate [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-F num : the max number of frames to unroll [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-S num : the max number of rounds w/o refinement to stop [default = %d]\n",
                (ulong)(uint)Pars.nRounds);
      Abc_Print(-2,"\t-M num : the min number of outputs of bounded SRM [default = %d]\n",
                (ulong)(uint)Pars.nFrames);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nNonRefines);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)Pars.nMinOutputs);
      pcVar3 = "circuit";
      if (Pars.TimeLimit != 0) {
        pcVar3 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.nBTLimit != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle using two POs intead of XOR [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fDualOut != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Semi( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParSmf_t Pars, * pPars = &Pars;
    int c;
    Cec_ManSmfSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WRFSMCTmdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNonRefines = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNonRefines < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMinOutputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMinOutputs < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOut ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Resim(): There is no AIG.\n" );
        return 1;
    }
    Cec_ManSeqSemiformal( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &semi [-WRFSMCT num] [-mdvh]\n" );
    Abc_Print( -2, "\t         performs semiformal refinement of equivalence classes\n" );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-R num : the max number of rounds to simulate [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-F num : the max number of frames to unroll [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-S num : the max number of rounds w/o refinement to stop [default = %d]\n", pPars->nNonRefines );
    Abc_Print( -2, "\t-M num : the min number of outputs of bounded SRM [default = %d]\n", pPars->nMinOutputs );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-d     : toggle using two POs intead of XOR [default = %s]\n", pPars->fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}